

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::Skip(TestInfo *this)

{
  int a_line_number;
  UnitTestImpl *this_00;
  UnitTest *this_01;
  TestEventListeners *this_02;
  char *a_file_name;
  TestPartResultReporterInterface *pTVar1;
  undefined1 local_90 [8];
  TestPartResult test_part_result;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  TestInfo *this_local;
  
  if ((this->should_run_ & 1U) != 0) {
    this_00 = internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_info(this_00,this);
    this_01 = UnitTest::GetInstance();
    this_02 = UnitTest::listeners(this_01);
    test_part_result.message_.field_2._8_8_ = TestEventListeners::repeater(this_02);
    (*((TestEventListener *)test_part_result.message_.field_2._8_8_)->_vptr_TestEventListener[8])
              (test_part_result.message_.field_2._8_8_,this);
    a_file_name = file(this);
    a_line_number = line(this);
    TestPartResult::TestPartResult
              ((TestPartResult *)local_90,kSkip,a_file_name,a_line_number,anon_var_dwarf_260822 + 9)
    ;
    pTVar1 = internal::UnitTestImpl::GetTestPartResultReporterForCurrentThread(this_00);
    (*pTVar1->_vptr_TestPartResultReporterInterface[2])(pTVar1,local_90);
    (**(code **)(*(long *)test_part_result.message_.field_2._8_8_ + 0x50))
              (test_part_result.message_.field_2._8_8_,this);
    internal::UnitTestImpl::set_current_test_info(this_00,(TestInfo *)0x0);
    TestPartResult::~TestPartResult((TestPartResult *)local_90);
  }
  return;
}

Assistant:

void TestInfo::Skip() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TestPartResult test_part_result =
      TestPartResult(TestPartResult::kSkip, this->file(), this->line(), "");
  impl->GetTestPartResultReporterForCurrentThread()->ReportTestPartResult(
      test_part_result);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);
  impl->set_current_test_info(nullptr);
}